

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataTypeRegister.cpp
# Opt level: O1

void __thiscall
Rml::TransformFuncRegister::Register
          (TransformFuncRegister *this,String *name,DataTransformFunc *transform_func)

{
  code *pcVar1;
  bool bVar2;
  pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
  pStack_38;
  
  if ((transform_func->super__Function_base)._M_manager == (_Manager_type)0x0) {
    bVar2 = Assert("RMLUI_ASSERT(transform_func)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataTypeRegister.cpp"
                   ,0x6d);
    if (!bVar2) goto LAB_001ffbf7;
  }
  robin_hood::detail::
  Table<true,80ul,std::__cxx11::string,std::function<Rml::Variant(std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
  ::
  emplace<std::__cxx11::string_const&,std::function<Rml::Variant(std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>>
            (&pStack_38,
             (Table<true,80ul,std::__cxx11::string,std::function<Rml::Variant(std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
              *)this,name,transform_func);
  if (pStack_38.second == false) {
    Log::Message(LT_ERROR,"Transform function \'%s\' already exists.",(name->_M_dataplus)._M_p);
    bVar2 = Assert("RMLUI_ERROR",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataTypeRegister.cpp"
                   ,0x72);
    if (!bVar2) {
LAB_001ffbf7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  return;
}

Assistant:

void TransformFuncRegister::Register(const String& name, DataTransformFunc transform_func)
{
	RMLUI_ASSERT(transform_func);
	bool inserted = transform_functions.emplace(name, std::move(transform_func)).second;
	if (!inserted)
	{
		Log::Message(Log::LT_ERROR, "Transform function '%s' already exists.", name.c_str());
		RMLUI_ERROR;
	}
}